

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

s32 __thiscall
irr::core::array<irr::video::CNullDriver::SSurface>::binary_search
          (array<irr::video::CNullDriver::SSurface> *this,SSurface *element,s32 left,s32 right)

{
  bool bVar1;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  __last;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  __val;
  difference_type dVar2;
  int in_ECX;
  int in_EDX;
  SSurface *in_RSI;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  it;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  rpos;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  lpos;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  in_stack_ffffffffffffff88;
  SSurface *in_stack_ffffffffffffff90;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  in_stack_ffffffffffffffb8;
  
  if (in_EDX <= in_ECX) {
    std::
    vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>::
    begin((vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
           *)in_stack_ffffffffffffff88._M_current);
    __last = ::std::
             next<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_const*,std::vector<irr::video::CNullDriver::SSurface,std::allocator<irr::video::CNullDriver::SSurface>>>>
                       (in_stack_ffffffffffffff88,0x316695);
    std::
    vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>::
    begin((vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
           *)in_stack_ffffffffffffff88._M_current);
    __val = ::std::
            next<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_const*,std::vector<irr::video::CNullDriver::SSurface,std::allocator<irr::video::CNullDriver::SSurface>>>>
                      (in_stack_ffffffffffffff88,0x3166b8);
    ::std::
    lower_bound<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_const*,std::vector<irr::video::CNullDriver::SSurface,std::allocator<irr::video::CNullDriver::SSurface>>>,irr::video::CNullDriver::SSurface>
              (in_stack_ffffffffffffffb8,__last,__val._M_current);
    __gnu_cxx::
    __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
    ::operator*((__normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                 *)&stack0xffffffffffffffb8);
    bVar1 = video::CNullDriver::SSurface::operator<
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88._M_current);
    if (!bVar1) {
      __gnu_cxx::
      __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
      ::operator*((__normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                   *)&stack0xffffffffffffffb8);
      bVar1 = video::CNullDriver::SSurface::operator<(in_RSI,in_stack_ffffffffffffff88._M_current);
      if (!bVar1) {
        std::
        vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
        ::begin((vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
                 *)in_stack_ffffffffffffff88._M_current);
        dVar2 = __gnu_cxx::operator-
                          ((__normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                            *)in_RSI,
                           (__normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                            *)in_stack_ffffffffffffff88._M_current);
        return (s32)dVar2;
      }
    }
  }
  return -1;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}